

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

void opj_worker_thread_function(void *user_data)

{
  int iVar1;
  long lVar2;
  undefined8 *ptr;
  opj_tls_t *tls;
  undefined8 *puVar3;
  
  lVar2 = *user_data;
  tls = opj_tls_new();
  pthread_mutex_lock(*(pthread_mutex_t **)(lVar2 + 0x18));
LAB_00108501:
  do {
    if (*(int *)(lVar2 + 0x20) == 1) {
LAB_00108602:
      pthread_mutex_unlock(*(pthread_mutex_t **)(lVar2 + 0x18));
LAB_0010860b:
      opj_tls_destroy(tls);
      return;
    }
    puVar3 = *(undefined8 **)(lVar2 + 0x28);
    if (puVar3 != (undefined8 *)0x0) {
      *(undefined8 *)(lVar2 + 0x28) = puVar3[1];
      ptr = (undefined8 *)*puVar3;
      pthread_mutex_unlock(*(pthread_mutex_t **)(lVar2 + 0x18));
      opj_free(puVar3);
      if (ptr == (undefined8 *)0x0) goto LAB_0010860b;
      if ((code *)*ptr != (code *)0x0) {
        (*(code *)*ptr)(ptr[1],tls);
      }
      opj_free(ptr);
      pthread_mutex_lock(*(pthread_mutex_t **)(lVar2 + 0x18));
      *(int *)(lVar2 + 0x30) = *(int *)(lVar2 + 0x30) + -1;
      if (*(int *)(lVar2 + 0x30) <= *(int *)(lVar2 + 0x50)) {
        opj_cond_signal(*(opj_cond_t **)(lVar2 + 0x10));
      }
      goto LAB_00108501;
    }
    if (*(int *)((long)user_data + 0x10) == 0) {
      *(undefined4 *)((long)user_data + 0x10) = 1;
      iVar1 = *(int *)(lVar2 + 0x40);
      *(int *)(lVar2 + 0x40) = iVar1 + 1;
      if (*(int *)(lVar2 + 8) <= iVar1) {
        __assert_fail("tp->waiting_worker_thread_count <= tp->worker_threads_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/thread.c"
                      ,0x31d,
                      "opj_worker_thread_job_t *opj_thread_pool_get_next_job(opj_thread_pool_t *, opj_worker_thread_t *, OPJ_BOOL)"
                     );
      }
      puVar3 = (undefined8 *)opj_malloc(0x10);
      if (puVar3 == (undefined8 *)0x0) {
        *(undefined4 *)(lVar2 + 0x20) = 2;
        opj_cond_signal(*(opj_cond_t **)(lVar2 + 0x10));
        goto LAB_00108602;
      }
      *puVar3 = user_data;
      puVar3[1] = *(undefined8 *)(lVar2 + 0x38);
      *(undefined8 **)(lVar2 + 0x38) = puVar3;
    }
    opj_cond_signal(*(opj_cond_t **)(lVar2 + 0x10));
    pthread_mutex_lock(*(pthread_mutex_t **)((long)user_data + 0x18));
    pthread_mutex_unlock(*(pthread_mutex_t **)(lVar2 + 0x18));
    pthread_cond_wait(*(pthread_cond_t **)((long)user_data + 0x20),
                      *(pthread_mutex_t **)((long)user_data + 0x18));
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)user_data + 0x18));
    pthread_mutex_lock(*(pthread_mutex_t **)(lVar2 + 0x18));
  } while( true );
}

Assistant:

static void opj_worker_thread_function(void* user_data)
{
    opj_worker_thread_t* worker_thread;
    opj_thread_pool_t* tp;
    opj_tls_t* tls;
    OPJ_BOOL job_finished = OPJ_FALSE;

    worker_thread = (opj_worker_thread_t*) user_data;
    tp = worker_thread->tp;
    tls = opj_tls_new();

    while (OPJ_TRUE) {
        opj_worker_thread_job_t* job = opj_thread_pool_get_next_job(tp, worker_thread,
                                       job_finished);
        if (job == NULL) {
            break;
        }

        if (job->job_fn) {
            job->job_fn(job->user_data, tls);
        }
        opj_free(job);
        job_finished = OPJ_TRUE;
    }

    opj_tls_destroy(tls);
}